

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_attach.hpp
# Opt level: O3

void __thiscall
duckdb::PhysicalAttach::PhysicalAttach
          (PhysicalAttach *this,
          unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> *info,
          idx_t estimated_cardinality)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_51;
  LogicalType local_50;
  pointer local_38;
  pointer pLStack_30;
  pointer local_28;
  
  LogicalType::LogicalType(&local_50,BOOLEAN);
  __l._M_len = 1;
  __l._M_array = &local_50;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38,__l,
             &local_51);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_0196ff50;
  (this->super_PhysicalOperator).type = ATTACH;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLStack_30;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  local_28 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pLStack_30 = (pointer)0x0;
  (this->super_PhysicalOperator).estimated_cardinality = estimated_cardinality;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38);
  LogicalType::~LogicalType(&local_50);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalAttach_01998188;
  (this->info).super_unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AttachInfo_*,_std::default_delete<duckdb::AttachInfo>_>.
  super__Head_base<0UL,_duckdb::AttachInfo_*,_false>._M_head_impl =
       (info->super_unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AttachInfo_*,_std::default_delete<duckdb::AttachInfo>_>.
       super__Head_base<0UL,_duckdb::AttachInfo_*,_false>._M_head_impl;
  (info->super_unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AttachInfo_*,_std::default_delete<duckdb::AttachInfo>_>.
  super__Head_base<0UL,_duckdb::AttachInfo_*,_false>._M_head_impl = (AttachInfo *)0x0;
  return;
}

Assistant:

explicit PhysicalAttach(unique_ptr<AttachInfo> info, idx_t estimated_cardinality)
	    : PhysicalOperator(PhysicalOperatorType::ATTACH, {LogicalType::BOOLEAN}, estimated_cardinality),
	      info(std::move(info)) {
	}